

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

void __thiscall geometrycentral::surface::SurfaceMesh::greedilyOrientFaces(SurfaceMesh *this)

{
  size_t sVar1;
  pointer puVar2;
  ParentMeshT *pPVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  pointer pcVar7;
  long lVar8;
  double *pdVar9;
  size_t i;
  size_t sVar10;
  iterator __position;
  unsigned_long uVar11;
  Face f_00;
  vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_> toProcess;
  Face fO;
  Face f;
  FaceData<double> processed;
  Face *local_b8;
  iterator iStack_b0;
  Face *local_a8;
  Face local_98;
  ParentMeshT *local_88;
  Face local_80;
  size_t local_70;
  MeshData<geometrycentral::surface::Face,_double> local_68;
  
  local_a8 = (Face *)0x0;
  local_b8 = (Face *)0x0;
  iStack_b0._M_current = (Face *)0x0;
  MeshData<geometrycentral::surface::Face,_double>::MeshData(&local_68,this,0.0);
  sVar1 = this->nFacesFillCount;
  if ((sVar1 == 0) ||
     (puVar2 = (this->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar2 != 0xffffffffffffffff)) {
    sVar10 = 0;
  }
  else {
    sVar10 = 0;
    do {
      if (sVar1 - 1 == sVar10) goto LAB_001632a6;
      lVar8 = sVar10 + 1;
      sVar10 = sVar10 + 1;
    } while (puVar2[lVar8] == 0xffffffffffffffff);
  }
  if (sVar10 != sVar1) {
    __position._M_current = (Face *)0x0;
    pdVar9 = local_68.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    local_88 = this;
    local_70 = sVar1;
    do {
      local_80.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
      mesh = local_88;
      local_80.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
      ind = sVar10;
      if ((pdVar9[sVar10] == 0.0) && (!NAN(pdVar9[sVar10]))) {
        if (__position._M_current == local_a8) {
          ::std::
          vector<geometrycentral::surface::Face,std::allocator<geometrycentral::surface::Face>>::
          _M_realloc_insert<geometrycentral::surface::Face_const&>
                    ((vector<geometrycentral::surface::Face,std::allocator<geometrycentral::surface::Face>>
                      *)&local_b8,__position,&local_80);
        }
        else {
          ((__position._M_current)->
          super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>).mesh
               = local_88;
          ((__position._M_current)->
          super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>).ind
               = sVar10;
          iStack_b0._M_current = iStack_b0._M_current + 1;
        }
        local_68.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[local_80.
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
               ind] = 1.0;
        pdVar9 = local_68.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        while (__position._M_current = (Face *)iStack_b0, local_b8 != iStack_b0._M_current) {
          pPVar3 = iStack_b0._M_current[-1].
                   super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                   .mesh;
          uVar4 = (pPVar3->fHalfedgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [iStack_b0._M_current[-1].
                   super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                   .ind];
          uVar11 = uVar4;
          iStack_b0._M_current = iStack_b0._M_current + -1;
          do {
            if (pPVar3->useImplicitTwinFlag == true) {
              puVar2 = (pPVar3->heFaceArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (*(ulong *)((long)puVar2 + (uVar11 * 8 | 8)) < pPVar3->nFacesFillCount) {
                local_98.
                super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                .ind = puVar2[uVar11 ^ 1];
                local_98.
                super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                .mesh = pPVar3;
                if ((pdVar9[local_98.
                            super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                            .ind] == 0.0) &&
                   (!NAN(pdVar9[local_98.
                                super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                                .ind]))) {
LAB_001633ff:
                  if (iStack_b0._M_current == local_a8) {
                    ::std::
                    vector<geometrycentral::surface::Face,std::allocator<geometrycentral::surface::Face>>
                    ::_M_realloc_insert<geometrycentral::surface::Face_const&>
                              ((vector<geometrycentral::surface::Face,std::allocator<geometrycentral::surface::Face>>
                                *)&local_b8,iStack_b0,&local_98);
                  }
                  else {
                    ((iStack_b0._M_current)->
                    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                    ).mesh = local_98.
                             super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                             .mesh;
                    ((iStack_b0._M_current)->
                    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                    ).ind = local_98.
                            super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                            .ind;
                    iStack_b0._M_current = iStack_b0._M_current + 1;
                  }
                  local_68.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data
                  [local_98.
                   super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                   .ind] = 1.0;
                  pdVar9 = local_68.data.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data;
                }
              }
            }
            else {
              puVar2 = (pPVar3->heSiblingArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar5 = (pPVar3->eHalfedgeArr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [(pPVar3->heEdgeArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11]];
              if ((puVar2[uVar5] != uVar5) && (puVar2[puVar2[uVar5]] == uVar5)) {
                local_98.
                super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                .ind = (pPVar3->heFaceArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[puVar2[uVar11]];
                local_98.
                super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                .mesh = pPVar3;
                if ((pdVar9[local_98.
                            super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                            .ind] == 0.0) &&
                   (!NAN(pdVar9[local_98.
                                super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                                .ind]))) {
                  puVar2 = (pPVar3->heSiblingArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  uVar5 = (pPVar3->eHalfedgeArr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start
                          [(pPVar3->heEdgeArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar11]];
                  uVar6 = puVar2[uVar5];
                  if ((uVar5 != uVar6) &&
                     ((puVar2[uVar6] != uVar5 ||
                      (pcVar7 = (pPVar3->heOrientArr).
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                      (pcVar7[uVar6] != '\0') == (pcVar7[uVar5] != '\0'))))) {
                    f_00.
                    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                    .ind = local_98.
                           super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                           .ind;
                    f_00.
                    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                    .mesh = pPVar3;
                    invertOrientation(local_88,f_00);
                  }
                  goto LAB_001633ff;
                }
              }
            }
            uVar11 = (pPVar3->heNextArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11];
          } while (uVar11 != uVar4);
        }
      }
      do {
        if (sVar1 - 1 == sVar10) goto LAB_001632a6;
        lVar8 = sVar10 + 1;
        sVar10 = sVar10 + 1;
      } while ((local_88->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8] == 0xffffffffffffffff);
    } while (local_70 != sVar10);
  }
LAB_001632a6:
  MeshData<geometrycentral::surface::Face,_double>::~MeshData(&local_68);
  if (local_b8 != (Face *)0x0) {
    operator_delete(local_b8);
  }
  return;
}

Assistant:

void SurfaceMesh::greedilyOrientFaces() {
  // TODO this is only lightly tested. Write some better tests.
  std::vector<Face> toProcess;
  FaceData<double> processed(*this, false);
  for (Face f : faces()) {
    if (processed[f]) continue;

    // start a new search
    toProcess.push_back(f);
    processed[f] = true;

    // cover the whole component
    while (!toProcess.empty()) {
      Face curr = toProcess.back();
      toProcess.pop_back();

      for (Halfedge he : curr.adjacentHalfedges()) {
        if (he.edge().isBoundary() || !he.edge().isManifold()) continue;
        Face fO = he.sibling().face();
        if (processed[fO]) continue;

        if (!he.edge().isOriented()) {
          invertOrientation(fO);
        }

        toProcess.push_back(fO);
        processed[fO] = true;
      }
    }
  }
}